

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O3

Maybe<unsigned_long> __thiscall
kj::TreeIndex<kj::TreeMap<unsigned_long,capnp::_::RawSchema*>::Callbacks>::
insert<kj::TreeMap<unsigned_long,capnp::_::RawSchema*>::Entry,unsigned_long&>
          (TreeIndex<kj::TreeMap<unsigned_long,capnp::_::RawSchema*>::Callbacks> *this,
          ArrayPtr<kj::TreeMap<unsigned_long,_capnp::_::RawSchema_*>::Entry> table,size_t pos,
          unsigned_long *params)

{
  uint uVar1;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 aVar2;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RDX;
  ulong uVar3;
  long *in_R9;
  Maybe<unsigned_long> MVar4;
  Iterator iter;
  Iterator IStack_68;
  size_t local_50;
  size_t local_48;
  SearchKey local_40;
  Entry *local_38;
  size_t *local_30;
  
  local_50 = table.size_;
  local_38 = table.ptr;
  local_30 = &local_50;
  local_40._vptr_SearchKey = (_func_int **)&PTR_search_0025f5d0;
  local_48 = pos;
  _::BTreeImpl::insert(&IStack_68,(BTreeImpl *)&local_38->value,&local_40);
  uVar3 = (ulong)IStack_68.row;
  if (uVar3 == 0xe) {
    uVar3 = 0xe;
  }
  else {
    uVar1 = (IStack_68.leaf)->rows[uVar3].i;
    if ((uVar1 != 0) &&
       (aVar2._0_4_ = uVar1 - 1, aVar2.value._4_4_ = 0,
       *(long *)(local_50 + aVar2.value * 0x10) == *in_R9)) {
      *this = (TreeIndex<kj::TreeMap<unsigned_long,capnp::_::RawSchema*>::Callbacks>)0x1;
      ((anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 *)(this + 8))->value =
           (unsigned_long)aVar2;
      goto LAB_001a2238;
    }
  }
  memmove((IStack_68.leaf)->rows + uVar3 + 1,(IStack_68.leaf)->rows + uVar3,
          (ulong)(IStack_68.row + 1) * -4 + 0x38);
  (IStack_68.leaf)->rows[uVar3].i = (int)params + 1;
  *this = (TreeIndex<kj::TreeMap<unsigned_long,capnp::_::RawSchema*>::Callbacks>)0x0;
  aVar2 = extraout_RDX;
LAB_001a2238:
  MVar4.ptr.field_1.value = aVar2.value;
  MVar4.ptr._0_8_ = this;
  return (Maybe<unsigned_long>)MVar4.ptr;
}

Assistant:

kj::Maybe<size_t> insert(kj::ArrayPtr<Row> table, size_t pos, Params&&... params) {
    auto iter = impl.insert(searchKey(table, params...));

    if (!iter.isEnd() && cb.matches(table[*iter], params...)) {
      return *iter;
    } else {
      iter.insert(impl, pos);
      return kj::none;
    }
  }